

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O2

void __thiscall basist::approx_move_to_front::use(approx_move_to_front *this,uint32_t index)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  if (index != 0) {
    piVar3 = basisu::vector<int>::operator[](&this->m_values,(ulong)(index >> 1));
    iVar1 = *piVar3;
    piVar3 = basisu::vector<int>::operator[](&this->m_values,(ulong)index);
    iVar2 = *piVar3;
    piVar3 = basisu::vector<int>::operator[](&this->m_values,(ulong)(index >> 1));
    *piVar3 = iVar2;
    piVar3 = basisu::vector<int>::operator[](&this->m_values,(ulong)index);
    *piVar3 = iVar1;
  }
  return;
}

Assistant:

void use(uint32_t index)
		{
			if (index)
			{
				//std::swap(m_values[index / 2], m_values[index]);
				int x = m_values[index / 2];
				int y = m_values[index];
				m_values[index / 2] = y;
				m_values[index] = x;
			}
		}